

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

bool __thiscall
wallet::WalletBatch::WriteDescriptorCacheItems
          (WalletBatch *this,uint256 *desc_id,DescriptorCache *cache)

{
  bool bVar1;
  bool bVar2;
  __node_base _Var3;
  _Hash_node_base *p_Var4;
  long in_FS_OFFSET;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  DescriptorCache::GetCachedParentExtPubKeys((ExtPubKeyMap *)&local_70,cache);
  for (_Var3._M_nxt = local_70._M_before_begin._M_nxt; _Var3._M_nxt != (_Hash_node_base *)0x0;
      _Var3._M_nxt = (_Var3._M_nxt)->_M_nxt) {
    bVar1 = WriteDescriptorParentCache
                      (this,(CExtPubKey *)((long)&_Var3._M_nxt[1]._M_nxt + 4),desc_id,
                       *(uint32_t *)&_Var3._M_nxt[1]._M_nxt);
    if (!bVar1) {
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_70);
      if (_Var3._M_nxt != (_Hash_node_base *)0x0) goto LAB_001aef5d;
      goto LAB_001aee94;
    }
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_70);
LAB_001aee94:
  DescriptorCache::GetCachedDerivedExtPubKeys
            ((unordered_map<unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>_>
              *)&local_70,cache);
  _Var3._M_nxt = local_70._M_before_begin._M_nxt;
  while( true ) {
    if (_Var3._M_nxt == (_Hash_node_base *)0x0) goto LAB_001aeee7;
    p_Var4 = _Var3._M_nxt + 4;
    do {
      p_Var4 = p_Var4->_M_nxt;
      if (p_Var4 == (_Hash_node_base *)0x0) goto LAB_001aeee1;
      bVar1 = WriteDescriptorDerivedCache
                        (this,(CExtPubKey *)((long)&p_Var4[1]._M_nxt + 4),desc_id,
                         *(uint32_t *)&_Var3._M_nxt[1]._M_nxt,*(uint32_t *)&p_Var4[1]._M_nxt);
    } while (bVar1);
    if (p_Var4 != (_Hash_node_base *)0x0) break;
LAB_001aeee1:
    _Var3._M_nxt = (_Var3._M_nxt)->_M_nxt;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_70);
  if (_Var3._M_nxt == (_Hash_node_base *)0x0) goto LAB_001aeef1;
LAB_001aef5d:
  bVar1 = false;
LAB_001aef5f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
LAB_001aeee7:
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_70);
LAB_001aeef1:
  DescriptorCache::GetCachedLastHardenedExtPubKeys((ExtPubKeyMap *)&local_70,cache);
  while ((bVar1 = local_70._M_before_begin._M_nxt == (_Hash_node_base *)0x0, !bVar1 &&
         (bVar2 = WriteDescriptorLastHardenedCache
                            (this,(CExtPubKey *)
                                  ((long)&local_70._M_before_begin._M_nxt[1]._M_nxt + 4),desc_id,
                             *(uint32_t *)&local_70._M_before_begin._M_nxt[1]._M_nxt), bVar2))) {
    local_70._M_before_begin._M_nxt = (local_70._M_before_begin._M_nxt)->_M_nxt;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_70);
  goto LAB_001aef5f;
}

Assistant:

bool WalletBatch::WriteDescriptorCacheItems(const uint256& desc_id, const DescriptorCache& cache)
{
    for (const auto& parent_xpub_pair : cache.GetCachedParentExtPubKeys()) {
        if (!WriteDescriptorParentCache(parent_xpub_pair.second, desc_id, parent_xpub_pair.first)) {
            return false;
        }
    }
    for (const auto& derived_xpub_map_pair : cache.GetCachedDerivedExtPubKeys()) {
        for (const auto& derived_xpub_pair : derived_xpub_map_pair.second) {
            if (!WriteDescriptorDerivedCache(derived_xpub_pair.second, desc_id, derived_xpub_map_pair.first, derived_xpub_pair.first)) {
                return false;
            }
        }
    }
    for (const auto& lh_xpub_pair : cache.GetCachedLastHardenedExtPubKeys()) {
        if (!WriteDescriptorLastHardenedCache(lh_xpub_pair.second, desc_id, lh_xpub_pair.first)) {
            return false;
        }
    }
    return true;
}